

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usha.c
# Opt level: O1

int USHAHashSizeBits(SHAversion whichSha)

{
  int iVar1;
  
  iVar1 = 0x200;
  if (whichSha < SHA512) {
    iVar1 = *(int *)(&DAT_001ba3d0 + (ulong)whichSha * 4);
  }
  return iVar1;
}

Assistant:

int USHAHashSizeBits(enum SHAversion whichSha)
{
    switch (whichSha) {
    case SHA1:   return SHA1HashSizeBits;
    case SHA224: return SHA224HashSizeBits;
    case SHA256: return SHA256HashSizeBits;
    case SHA384: return SHA384HashSizeBits;
    default:
    case SHA512: return SHA512HashSizeBits;
    }
}